

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void mp::WriteModelItem(MemoryWriter *wrt,QuadraticObjective *obj,ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  Type TVar1;
  size_t sVar2;
  LinTerms *in_RDX;
  MemoryWriter *in_RSI;
  BasicWriter<char> *in_RDI;
  ItemNamer *in_stack_00000040;
  QuadTerms *in_stack_00000048;
  MemoryWriter *in_stack_00000050;
  undefined7 in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff6f;
  BasicWriter<char> *in_stack_ffffffffffffff70;
  BasicWriter<char> *in_stack_ffffffffffffff90;
  BasicWriter<char> *this;
  char *pcVar3;
  BasicWriter<char> *pBVar4;
  ItemNamer *in_stack_ffffffffffffffe0;
  
  pBVar4 = in_RDI;
  TVar1 = LinearObjective::obj_sense((LinearObjective *)in_RSI);
  if (TVar1 == MIN) {
    pcVar3 = "minimize ";
  }
  else {
    pcVar3 = "maximize ";
  }
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_ffffffffffffff70,
             (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  value.size_ = (size_t)pBVar4;
  value.data_ = pcVar3;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,value);
  LinearObjective::name((LinearObjective *)0x50b8c7);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_ffffffffffffff70,
             (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  value_00.size_ = (size_t)pBVar4;
  value_00.data_ = pcVar3;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,value_00);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_ffffffffffffff70,
             (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  value_01.size_ = (size_t)pBVar4;
  value_01.data_ = pcVar3;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,value_01);
  this = in_RDI;
  LinearObjective::GetLinTerms((LinearObjective *)in_RSI);
  WriteModelItem(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  QuadraticObjective::GetQPTerms((QuadraticObjective *)in_RSI);
  sVar2 = QuadTerms::size((QuadTerms *)0x50b956);
  if (sVar2 != 0) {
    LinearObjective::GetLinTerms((LinearObjective *)in_RSI);
    sVar2 = LinTerms::size((LinTerms *)0x50b975);
    if (sVar2 != 0) {
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      value_02.size_ = (size_t)pBVar4;
      value_02.data_ = pcVar3;
      fmt::BasicWriter<char>::operator<<(this,value_02);
    }
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
    QuadraticObjective::GetQPTerms((QuadraticObjective *)in_RSI);
    WriteModelItem(in_stack_00000050,in_stack_00000048,in_stack_00000040);
    fmt::BasicWriter<char>::operator<<(in_RDI,in_stack_ffffffffffffff6f);
  }
  return;
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const QuadraticObjective& obj,
                    ItemNamer& vnam) {
  wrt << (obj.obj_sense() ? "maximize " : "minimize ");
  assert(obj.name() && *obj.name());
  wrt << obj.name() << ": ";
  WriteModelItem(wrt, obj.GetLinTerms(), vnam);
  if (obj.GetQPTerms().size()) {
    if (obj.GetLinTerms().size())
      wrt << " + ";
    wrt << '(';
    WriteModelItem(wrt, obj.GetQPTerms(), vnam);
    wrt << ')';
  }
}